

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.hpp
# Opt level: O1

string * __thiscall
sciplot::gnuplot::sizestr_abi_cxx11_
          (string *__return_storage_ptr__,gnuplot *this,size_t width,size_t height,bool asinches)

{
  size_type *psVar1;
  long *plVar2;
  undefined8 *puVar3;
  ulong *puVar4;
  ulong uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong *local_b8;
  long local_b0;
  ulong local_a8;
  undefined8 uStack_a0;
  string local_98;
  string local_78;
  size_t local_58;
  string local_50;
  gnuplot *local_30;
  double local_28;
  double local_20;
  
  local_58 = width;
  local_30 = this;
  if ((int)height == 0) {
    internal::str<unsigned_long>(&local_98,(unsigned_long *)&local_30);
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_98);
    puVar4 = puVar3 + 2;
    if ((ulong *)*puVar3 == puVar4) {
      local_a8 = *puVar4;
      uStack_a0 = puVar3[3];
      local_b8 = &local_a8;
    }
    else {
      local_a8 = *puVar4;
      local_b8 = (ulong *)*puVar3;
    }
    local_b0 = puVar3[1];
    *puVar3 = puVar4;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    internal::str<unsigned_long>(&local_78,&local_58);
    uVar5 = 0xf;
    if (local_b8 != &local_a8) {
      uVar5 = local_a8;
    }
    if (uVar5 < local_78._M_string_length + local_b0) {
      uVar6 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        uVar6 = local_78.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar6 < local_78._M_string_length + local_b0) goto LAB_001717bd;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_b8);
    }
    else {
LAB_001717bd:
      puVar3 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_78._M_dataplus._M_p);
    }
  }
  else {
    auVar7._8_4_ = (int)((ulong)this >> 0x20);
    auVar7._0_8_ = this;
    auVar7._12_4_ = 0x45300000;
    local_20 = ((auVar7._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)this) - 4503599627370496.0)) * 0.013888888888888888
    ;
    internal::str<double>(&local_78,&local_20);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_78);
    puVar4 = (ulong *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar4) {
      local_98.field_2._M_allocated_capacity = *puVar4;
      local_98.field_2._8_8_ = plVar2[3];
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    }
    else {
      local_98.field_2._M_allocated_capacity = *puVar4;
      local_98._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_98._M_string_length = plVar2[1];
    *plVar2 = (long)puVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    auVar8._0_8_ = (double)CONCAT44(0x43300000,(int)local_58);
    auVar8._8_4_ = (int)(local_58 >> 0x20);
    auVar8._12_4_ = 0x45300000;
    local_28 = ((auVar8._8_8_ - 1.9342813113834067e+25) + (auVar8._0_8_ - 4503599627370496.0)) *
               0.013888888888888888;
    internal::str<double>(&local_50,&local_28);
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      uVar6 = local_98.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar6 < local_50._M_string_length + local_98._M_string_length) {
      uVar6 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        uVar6 = local_50.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar6 < local_50._M_string_length + local_98._M_string_length) goto LAB_00171735;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_50,0,(char *)0x0,(ulong)local_98._M_dataplus._M_p);
    }
    else {
LAB_00171735:
      puVar3 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_50._M_dataplus._M_p);
    }
    local_b8 = &local_a8;
    puVar4 = puVar3 + 2;
    if ((ulong *)*puVar3 == puVar4) {
      local_a8 = *puVar4;
      uStack_a0 = puVar3[3];
    }
    else {
      local_a8 = *puVar4;
      local_b8 = (ulong *)*puVar3;
    }
    local_b0 = puVar3[1];
    *puVar3 = puVar4;
    puVar3[1] = 0;
    *(undefined1 *)puVar4 = 0;
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_b8);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar3 + 2;
  if ((size_type *)*puVar3 == psVar1) {
    uVar6 = puVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar6;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar3[1];
  *puVar3 = psVar1;
  puVar3[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((char)height == '\0') {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    local_50.field_2._M_allocated_capacity = local_98.field_2._M_allocated_capacity;
    local_50._M_dataplus._M_p = local_98._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == &local_98.field_2) goto LAB_001718f9;
  }
  else {
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_001718f9;
  }
  operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
LAB_001718f9:
  if ((char)height != '\0') {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline auto sizestr(std::size_t width, std::size_t height, bool asinches) -> std::string
{
    return asinches ? (internal::str(width * POINT_TO_INCHES) + "in," + internal::str(height * POINT_TO_INCHES) + "in") : (internal::str(width) + "," + internal::str(height));
}